

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger base_call_method_impl(HSQUIRRELVM v,bool safe)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  SQObjectType type;
  SQObjectType type_00;
  SQTable *pSVar3;
  SQTable *this;
  uint uVar4;
  undefined1 uVar5;
  undefined3 uVar6;
  SQObjectValue SVar7;
  bool bVar8;
  ulong uVar9;
  SQObjectPtr *pSVar10;
  long lVar11;
  SQRESULT SVar12;
  long lVar13;
  SQChar *pSVar14;
  size_type sVar15;
  char *__format;
  SQUnsignedInteger size;
  uint uVar16;
  uint uVar17;
  sqvector<SQObjectPtr,_unsigned_int> args;
  bool t;
  SQObjectPtr ret;
  bool s;
  undefined1 uStack_474;
  undefined3 uStack_473;
  SQObjectValue SStack_470;
  undefined8 local_468;
  undefined4 local_460;
  SQObjectPtr callee;
  SQChar message [1024];
  
  memset(message,0,0x400);
  uVar9 = sq_gettop(v);
  uVar16 = (uint)uVar9;
  if ((int)uVar16 < 3) {
    if (!safe) {
      snprintf(message,0x400,
               "\'__call_method(...)\' recieves at least 2 arguments (%d), object to method on and method\'s name"
               ,uVar9 & 0xffffffff);
      goto LAB_00120cc5;
    }
    uVar9 = (ulong)(int)uVar16;
    goto LAB_00120c4a;
  }
  pSVar10 = SQVM::GetAt(v,v->_stackbase + 1);
  type = (pSVar10->super_SQObject)._type;
  local_468 = *(undefined8 *)&(pSVar10->super_SQObject)._flags;
  local_460 = *(undefined4 *)((long)&(pSVar10->super_SQObject)._unVal + 4);
  pSVar10 = SQVM::GetAt(v,v->_stackbase + 2);
  type_00 = (pSVar10->super_SQObject)._type;
  if (type_00 == OT_STRING) {
    pSVar3 = (pSVar10->super_SQObject)._unVal.pTable;
    if ((int)type < 0x8000400) {
      if ((int)type < 0x8000010) {
        lVar11 = 0xe8;
        if (((type == OT_BOOL) || (type == OT_INTEGER)) || (type == OT_FLOAT)) goto LAB_00120d76;
      }
      else if ((int)type < 0x8000100) {
        if (type == OT_STRING) {
          lVar11 = 0xd8;
          goto LAB_00120d76;
        }
        if (type == OT_ARRAY) {
          lVar11 = 200;
          goto LAB_00120d76;
        }
      }
      else if ((type == OT_CLOSURE) || (type == OT_NATIVECLOSURE)) {
        lVar11 = 0x108;
        goto LAB_00120d76;
      }
    }
    else if ((int)type < 0x8010000) {
      if (type == OT_GENERATOR) {
        lVar11 = 0xf8;
LAB_00120d76:
        this = *(SQTable **)((long)&v->_sharedstate->_alloc_ctx + lVar11);
        callee.super_SQObject._unVal.pTable = (SQTable *)0x0;
        callee.super_SQObject._type = OT_NULL;
        callee.super_SQObject._flags = '\0';
        callee.super_SQObject._5_3_ = 0;
        args._vals = (SQObjectPtr *)
                     CONCAT44(*(undefined4 *)&(pSVar10->super_SQObject)._flags,0x8000010);
        pSVar2 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar2 = *pSVar2 + 1;
        args._alloc_ctx = (SQAllocContext)pSVar3;
        bVar8 = SQTable::Get(this,(SQObjectPtr *)&args,&callee);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&args);
        if (bVar8) {
          args._alloc_ctx = v->_sharedstate->_alloc_ctx;
          args._vals = (SQObjectPtr *)0x0;
          args._size = 0;
          args._allocated = 0;
          uVar17 = uVar16 - 2;
          size = (ulong)uVar17 << 4;
          args._vals = (SQObjectPtr *)sq_vm_realloc(args._alloc_ctx,(void *)0x0,0,size);
          ret.super_SQObject._4_4_ = SUB84(local_468,0);
          ret.super_SQObject._unVal.fFloat = (SQFloat)((ulong)local_468 >> 0x20);
          ret.super_SQObject._unVal.nInteger._4_4_ = local_460;
          if ((type >> 0x1b & 1) != 0) {
            plVar1 = (long *)(CONCAT44(local_460,ret.super_SQObject._unVal.fFloat) + 8);
            *plVar1 = *plVar1 + 1;
          }
          sVar15 = args._size;
          ret.super_SQObject._type = type;
          args._allocated = uVar17;
          if (uVar17 <= args._size) {
            uVar9 = 4;
            if (args._size * 2 != 0) {
              uVar9 = (ulong)(args._size * 2);
            }
            args._vals = (SQObjectPtr *)sq_vm_realloc(args._alloc_ctx,args._vals,size,uVar9 << 4);
            args._allocated = (size_type)uVar9;
            sVar15 = args._size;
          }
          args._size = sVar15 + 1;
          SVar7.nInteger._4_4_ = ret.super_SQObject._unVal.nInteger._4_4_;
          SVar7.fFloat = ret.super_SQObject._unVal.fFloat;
          pSVar10 = args._vals + sVar15;
          (pSVar10->super_SQObject)._type = ret.super_SQObject._type;
          (pSVar10->super_SQObject)._flags = ret.super_SQObject._flags;
          *(int3 *)&(pSVar10->super_SQObject).field_0x5 = ret.super_SQObject._5_3_;
          (pSVar10->super_SQObject)._unVal = SVar7;
          if ((args._vals[sVar15].super_SQObject._type & 0x8000000) != 0) {
            pSVar2 = &((args._vals[sVar15].super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar2 = *pSVar2 + 1;
          }
          SQObjectPtr::~SQObjectPtr(&ret);
          if (uVar16 != 3) {
            lVar11 = 3;
            do {
              pSVar10 = SQVM::GetAt(v,v->_stackbase + lVar11);
              _s = (pSVar10->super_SQObject)._type;
              uVar5 = (pSVar10->super_SQObject)._flags;
              uVar6 = *(undefined3 *)&(pSVar10->super_SQObject).field_0x5;
              unique0x10000436 = CONCAT31(uVar6,uVar5);
              SStack_470 = (SQObjectValue)(pSVar10->super_SQObject)._unVal.pTable;
              ret.super_SQObject._unVal.fFloat = SStack_470._0_4_;
              ret.super_SQObject._unVal.nInteger._4_4_ = (undefined4)((ulong)SStack_470 >> 0x20);
              if ((_s & 0x8000000) != 0) {
                pSVar2 = &((SStack_470.pTable)->super_SQDelegable).super_SQCollectable.
                          super_SQRefCounted._uiRef;
                *pSVar2 = *pSVar2 + 1;
              }
              uVar4 = args._size;
              ret.super_SQObject._type = _s;
              ret.super_SQObject._4_4_ = unique0x10000436;
              if (args._allocated <= args._size) {
                uVar4 = args._size * 2;
                if (args._size * 2 == 0) {
                  uVar4 = 4;
                }
                args._vals = (SQObjectPtr *)
                             sq_vm_realloc(args._alloc_ctx,args._vals,(ulong)args._allocated << 4,
                                           (ulong)uVar4 << 4);
                args._allocated = uVar4;
                uVar4 = args._size;
              }
              args._size = uVar4 + 1;
              pSVar10 = args._vals + uVar4;
              (pSVar10->super_SQObject)._type = _s;
              (pSVar10->super_SQObject)._flags = uStack_474;
              *(undefined3 *)&(pSVar10->super_SQObject).field_0x5 = uStack_473;
              (pSVar10->super_SQObject)._unVal.pTable = (SQTable *)SStack_470;
              if ((args._vals[uVar4].super_SQObject._type & 0x8000000) != 0) {
                pSVar2 = &((args._vals[uVar4].super_SQObject._unVal.pTable)->super_SQDelegable).
                          super_SQCollectable.super_SQRefCounted._uiRef;
                *pSVar2 = *pSVar2 + 1;
              }
              SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&s);
              lVar13 = lVar11 + (5 - (ulong)(uVar16 + 1));
              lVar11 = lVar11 + 1;
            } while (lVar13 != 3);
          }
          if (args._size != 0) {
            lVar11 = 0;
            uVar9 = 0;
            do {
              SQVM::Push(v,(SQObjectPtr *)((long)&((args._vals)->super_SQObject)._type + lVar11));
              uVar9 = uVar9 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar9 < (args._16_8_ & 0xffffffff));
          }
          ret.super_SQObject._flags = '\0';
          ret.super_SQObject._5_3_ = 0;
          ret.super_SQObject._unVal.fFloat = 0.0;
          ret.super_SQObject._unVal.nInteger._4_4_ = 0;
          ret.super_SQObject._type = OT_NULL;
          bVar8 = SQVM::CallNative(v,callee.super_SQObject._unVal.pNativeClosure,(ulong)uVar17,
                                   v->_stackbase + (ulong)(uVar16 & 0x7fffffff),&ret,-1,&s,&t);
          SVar12 = -1;
          if (bVar8) {
            SQVM::Pop(v,(ulong)(uVar16 & 0x7fffffff));
            SVar12 = 1;
            SQVM::Push(v,&ret);
          }
          SQObjectPtr::~SQObjectPtr(&ret);
          sqvector<SQObjectPtr,_unsigned_int>::_releasedata(&args);
        }
        else if (safe) {
          SQVM::Pop(v,(ulong)(uVar16 & 0x7fffffff));
          SVar12 = 1;
          SQVM::PushNull(v);
        }
        else {
          pSVar14 = IdType2Name(type);
          snprintf(message,0x400,"function \'%s\' not found in \'%s\' delegates",&pSVar3->_firstfree
                   ,pSVar14);
          SVar12 = sq_throwerror(v,message);
        }
        SQObjectPtr::~SQObjectPtr(&callee);
        return SVar12;
      }
      if (type == OT_THREAD) {
        lVar11 = 0x118;
        goto LAB_00120d76;
      }
      if (type == OT_CLASS) {
        lVar11 = 0x128;
        goto LAB_00120d76;
      }
    }
    else if ((int)type < 0xa000080) {
      if (type == OT_WEAKREF) {
        lVar11 = 0x148;
        goto LAB_00120d76;
      }
      if (type == OT_TABLE) {
        lVar11 = 0xb8;
        goto LAB_00120d76;
      }
    }
    else {
      if (type == OT_USERDATA) {
        lVar11 = 0x158;
        goto LAB_00120d76;
      }
      if (type == OT_INSTANCE) {
        lVar11 = 0x138;
        goto LAB_00120d76;
      }
    }
    if (!safe) {
      pSVar14 = IdType2Name(type);
      __format = "unsupported object type \'%s\' as receiver in \'__call_method(...)\' function";
      goto LAB_00120ca8;
    }
  }
  else if (!safe) {
    pSVar14 = IdType2Name(type_00);
    __format = "\'__call_method(...)\' expects 2nd argument to be string, actual \'%s\'";
LAB_00120ca8:
    snprintf(message,0x400,__format,pSVar14);
LAB_00120cc5:
    SVar12 = sq_throwerror(v,message);
    return SVar12;
  }
  uVar9 = (ulong)(uVar16 & 0x7fffffff);
LAB_00120c4a:
  SQVM::Pop(v,uVar9);
  SQVM::PushNull(v);
  return 1;
}

Assistant:

static SQInteger base_call_method_impl(HSQUIRRELVM v, bool safe)
{
    SQChar message[1024] = {0};
    int32_t nArgs = sq_gettop(v);

    if (nArgs < 3)
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' recieves at least 2 arguments (%d), object to method on and method's name"), nArgs);
        return sq_throwerror(v, message);
    }

    SQObject obj = stack_get(v, 2);
    SQObject name = stack_get(v, 3);

    if (!sq_isstring(name))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' expects 2nd argument to be string, actual '%s'"), IdType2Name(sq_type(name)));
        return sq_throwerror(v, message);
    }

    SQObject delegates;
    SQObjectType type = sq_type(obj);
    switch (type)
    {
    case OT_INTEGER:
    case OT_FLOAT:
    case OT_BOOL:
        delegates = _ss(v)->_number_default_delegate;
        break;
    case OT_STRING:
        delegates = _ss(v)->_string_default_delegate;
        break;
    case OT_TABLE:
        delegates = _ss(v)->_table_default_delegate;
        break;
    case OT_ARRAY:
        delegates = _ss(v)->_array_default_delegate;
        break;
    case OT_USERDATA:
        delegates = _ss(v)->_userdata_default_delegate;
        break;
    case OT_CLOSURE:
    case OT_NATIVECLOSURE:
        delegates = _ss(v)->_closure_default_delegate;
        break;
    case OT_GENERATOR:
        delegates = _ss(v)->_generator_default_delegate;
        break;
    case OT_THREAD:
        delegates = _ss(v)->_thread_default_delegate;
        break;
    case OT_CLASS:
        delegates = _ss(v)->_class_default_delegate;
        break;
    case OT_INSTANCE:
        delegates = _ss(v)->_instance_default_delegate;
        break;
    case OT_WEAKREF:
        delegates = _ss(v)->_weakref_default_delegate;
        break;
    default:
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("unsupported object type '%s' as receiver in '__call_method(...)' function"), IdType2Name(type));
        return sq_throwerror(v, message);
    }

    assert(sq_istable(delegates));

    SQObjectPtr callee;
    if (!_table(delegates)->Get(name, callee))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        else
        {
            snprintf(message, sizeof message, _SC("function '%s' not found in '%s' delegates"), _stringval(name), IdType2Name(type));
            return sq_throwerror(v, message);
        }
    }

    assert(sq_isnativeclosure(callee));

    sqvector<SQObjectPtr> args(_ss(v)->_alloc_ctx);

    args.reserve(nArgs - 2);
    args.push_back(obj);

    for (int32_t i = 4; i <= nArgs; ++i) // skip reciever + name
    {
        SQObject arg = stack_get(v, i);
        args.push_back(arg);
    }

    for (int32_t i = 0; i < args.size(); ++i)
    {
        v->Push(args[i]);
    }

    bool s, t;
    SQObjectPtr ret;
    if (!v->CallNative(_nativeclosure(callee), nArgs - 2, v->_stackbase + nArgs, ret, -1, s, t))
    {
        return SQ_ERROR;
    }

    v->Pop(nArgs);
    v->Push(ret);
    return 1;
}